

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::Swap(FileOptions *this,FileOptions *other)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  string *psVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  
  if (other != this) {
    psVar4 = this->java_package_;
    this->java_package_ = other->java_package_;
    other->java_package_ = psVar4;
    psVar4 = this->java_outer_classname_;
    this->java_outer_classname_ = other->java_outer_classname_;
    other->java_outer_classname_ = psVar4;
    bVar1 = this->java_multiple_files_;
    this->java_multiple_files_ = other->java_multiple_files_;
    other->java_multiple_files_ = bVar1;
    bVar1 = this->java_generate_equals_and_hash_;
    this->java_generate_equals_and_hash_ = other->java_generate_equals_and_hash_;
    other->java_generate_equals_and_hash_ = bVar1;
    iVar2 = this->optimize_for_;
    this->optimize_for_ = other->optimize_for_;
    other->optimize_for_ = iVar2;
    psVar4 = this->go_package_;
    this->go_package_ = other->go_package_;
    other->go_package_ = psVar4;
    bVar1 = this->cc_generic_services_;
    this->cc_generic_services_ = other->cc_generic_services_;
    other->cc_generic_services_ = bVar1;
    bVar1 = this->java_generic_services_;
    this->java_generic_services_ = other->java_generic_services_;
    other->java_generic_services_ = bVar1;
    bVar1 = this->py_generic_services_;
    this->py_generic_services_ = other->py_generic_services_;
    other->py_generic_services_ = bVar1;
    internal::RepeatedPtrFieldBase::Swap
              (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
               &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
    uVar3 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar3;
    pvVar5 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar5;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
    internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
    return;
  }
  return;
}

Assistant:

void FileOptions::Swap(FileOptions* other) {
  if (other != this) {
    std::swap(java_package_, other->java_package_);
    std::swap(java_outer_classname_, other->java_outer_classname_);
    std::swap(java_multiple_files_, other->java_multiple_files_);
    std::swap(java_generate_equals_and_hash_, other->java_generate_equals_and_hash_);
    std::swap(optimize_for_, other->optimize_for_);
    std::swap(go_package_, other->go_package_);
    std::swap(cc_generic_services_, other->cc_generic_services_);
    std::swap(java_generic_services_, other->java_generic_services_);
    std::swap(py_generic_services_, other->py_generic_services_);
    uninterpreted_option_.Swap(&other->uninterpreted_option_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
    _extensions_.Swap(&other->_extensions_);
  }
}